

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

CRollingBloomFilter * __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::RecentRejectsFilter(PeerManagerImpl *this)

{
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *this_00;
  _Head_base<0UL,_CRollingBloomFilter_*,_false> __ptr;
  _Head_base<0UL,_CRollingBloomFilter_*,_false> this_01;
  pointer __p;
  long in_FS_OFFSET;
  CRollingBloomFilter *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_lazy_recent_rejects;
  if ((this->m_lazy_recent_rejects)._M_t.
      super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>._M_t.
      super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
      super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl == (CRollingBloomFilter *)0x0
     ) {
    this_01._M_head_impl = (CRollingBloomFilter *)operator_new(0x30);
    CRollingBloomFilter::CRollingBloomFilter(this_01._M_head_impl,120000,1e-06);
    local_20 = (CRollingBloomFilter *)0x0;
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>._M_t.
         super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
         super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>._M_t.
    super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
    super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl = this_01._M_head_impl;
    if (__ptr._M_head_impl != (CRollingBloomFilter *)0x0) {
      std::default_delete<CRollingBloomFilter>::operator()
                ((default_delete<CRollingBloomFilter> *)this_00,__ptr._M_head_impl);
    }
    if (local_20 != (CRollingBloomFilter *)0x0) {
      std::default_delete<CRollingBloomFilter>::operator()
                ((default_delete<CRollingBloomFilter> *)&local_20,local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (this_00->_M_t).
           super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
           super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(m_tx_download_mutex)
    {
        AssertLockHeld(m_tx_download_mutex);

        if (!m_lazy_recent_rejects) {
            m_lazy_recent_rejects = std::make_unique<CRollingBloomFilter>(120'000, 0.000'001);
        }

        return *m_lazy_recent_rejects;
    }